

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::Mesh::createColocals(Mesh *this)

{
  Array<unsigned_int> *this_00;
  uint8_t *puVar1;
  float *pfVar2;
  float fVar3;
  float newCapacity;
  uint uVar4;
  uint8_t *puVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  char *__function;
  long lVar9;
  uint32_t newBufferSize;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint32_t otherVertex;
  Array<unsigned_int> colocals;
  Array<xatlas::internal::AABB> aabbs;
  Array<unsigned_int> potential;
  BVH bvh;
  float local_cc;
  AABB local_c8;
  ArrayBase local_b0;
  ArrayBase local_98;
  ArrayBase local_80;
  BVH local_68;
  
  newCapacity = (float)(this->m_positions).m_base.size;
  local_98.buffer = (uint8_t *)0x0;
  local_98.elementSize = 0x18;
  local_98.capacity = 0;
  local_98.size = (uint32_t)newCapacity;
  if ((ulong)(uint)newCapacity != 0) {
    ArrayBase::setArrayCapacity(&local_98,(uint32_t)newCapacity);
  }
  uVar8 = (ulong)(this->m_positions).m_base.size;
  if (uVar8 != 0) {
    puVar5 = (this->m_positions).m_base.buffer;
    lVar9 = 0;
    do {
      fVar3 = this->m_epsilon;
      fVar12 = *(float *)(puVar5 + lVar9);
      fVar11 = *(float *)(puVar5 + lVar9 + 4);
      fVar10 = *(float *)(puVar5 + lVar9 + 8);
      fVar13 = fVar10;
      fVar14 = fVar12;
      fVar15 = fVar11;
      if (0.0 < fVar3) {
        fVar13 = fVar10 - fVar3;
        fVar14 = fVar12 - fVar3;
        fVar15 = fVar11 - fVar3;
        fVar10 = fVar10 + fVar3;
        fVar11 = fVar3 + fVar11;
        fVar12 = fVar3 + fVar12;
      }
      if ((ulong)local_98.size * 0xc == lVar9) {
        __function = 
        "T &xatlas::internal::Array<xatlas::internal::AABB>::operator[](uint32_t) [T = xatlas::internal::AABB]"
        ;
        goto LAB_001ad941;
      }
      *(float *)(local_98.buffer + lVar9 * 2) = fVar14;
      *(float *)(local_98.buffer + lVar9 * 2 + 4) = fVar15;
      *(float *)(local_98.buffer + lVar9 * 2 + 8) = fVar13;
      *(float *)(local_98.buffer + lVar9 * 2 + 0xc) = fVar12;
      *(float *)(local_98.buffer + lVar9 * 2 + 0x10) = fVar11;
      *(float *)(local_98.buffer + lVar9 * 2 + 0x14) = fVar10;
      lVar9 = lVar9 + 0xc;
    } while (uVar8 * 0xc != lVar9);
  }
  BVH::BVH(&local_68,(Array<xatlas::internal::AABB> *)&local_98,4);
  local_b0.buffer = (uint8_t *)0x0;
  local_b0.elementSize = 4;
  local_b0.size = 0;
  local_b0.capacity = 0;
  local_80.buffer = (uint8_t *)0x0;
  local_80.elementSize = 4;
  local_80.size = 0;
  local_80.capacity = 0;
  this->m_colocalVertexCount = 0;
  this_00 = &this->m_nextColocalVertex;
  (this->m_nextColocalVertex).m_base.size = (uint32_t)newCapacity;
  if ((this->m_nextColocalVertex).m_base.capacity < (uint)newCapacity) {
    ArrayBase::setArrayCapacity(&this_00->m_base,(uint32_t)newCapacity);
  }
  if (newCapacity != 0.0) {
    puVar5 = (this_00->m_base).buffer;
    uVar8 = 0;
    do {
      if ((this->m_nextColocalVertex).m_base.size <= uVar8) goto LAB_001ad92c;
      puVar1 = puVar5 + uVar8 * 4;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      uVar8 = uVar8 + 1;
    } while ((uint)newCapacity != uVar8);
  }
  local_cc = 0.0;
  if (newCapacity != 0.0) {
    do {
      if ((this->m_nextColocalVertex).m_base.size <= (uint)local_cc) {
LAB_001ad92c:
        __function = 
        "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
LAB_001ad941:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,__function);
      }
      if (*(int *)((this_00->m_base).buffer + (ulong)(uint)local_cc * 4) == -1) {
        local_b0._8_8_ = local_b0._8_8_ & 0xffffffff;
        ArrayBase::push_back(&local_b0,(uint8_t *)&local_cc);
        uVar8 = (ulong)(uint)local_cc;
        if ((this->m_positions).m_base.size <= (uint)local_cc) {
LAB_001ad915:
          __function = 
          "T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) [T = xatlas::internal::Vector3]"
          ;
          goto LAB_001ad941;
        }
        puVar5 = (this->m_positions).m_base.buffer;
        fVar3 = this->m_epsilon;
        local_c8.min.z = *(float *)(puVar5 + uVar8 * 0xc + 8);
        local_c8.min._0_8_ = *(undefined8 *)(puVar5 + uVar8 * 0xc);
        local_c8.max.z = *(float *)(puVar5 + uVar8 * 0xc + 8);
        local_c8.max._0_8_ = *(undefined8 *)(puVar5 + uVar8 * 0xc);
        if (0.0 < fVar3) {
          local_c8.min.y = local_c8.min.y - fVar3;
          local_c8.min.x = local_c8.min.x - fVar3;
          local_c8.min.z = local_c8.min.z - fVar3;
          local_c8.max.y = local_c8.max.y + fVar3;
          local_c8.max.x = local_c8.max.x + fVar3;
          local_c8.max.z = fVar3 + local_c8.max.z;
        }
        BVH::query(&local_68,&local_c8,(Array<unsigned_int> *)&local_80);
        if (local_80.size != 0) {
          uVar8 = 0;
          do {
            fVar3 = *(float *)(local_80.buffer + uVar8 * 4);
            uVar7 = (ulong)(uint)fVar3;
            local_c8.min.x = fVar3;
            if (fVar3 != local_cc) {
              fVar12 = (float)(this->m_positions).m_base.size;
              if (((uint)fVar12 <= (uint)local_cc) || ((uint)fVar12 <= (uint)fVar3))
              goto LAB_001ad915;
              puVar5 = (this->m_positions).m_base.buffer;
              pfVar2 = (float *)(puVar5 + (ulong)(uint)local_cc * 0xc);
              fVar12 = this->m_epsilon;
              if (((ABS(*pfVar2 - *(float *)(puVar5 + uVar7 * 0xc)) <= fVar12) &&
                  (ABS(pfVar2[1] - *(float *)(puVar5 + uVar7 * 0xc + 4)) <= fVar12)) &&
                 (ABS(pfVar2[2] - *(float *)(puVar5 + uVar7 * 0xc + 8)) <= fVar12)) {
                if ((this->m_nextColocalVertex).m_base.size <= (uint)fVar3) goto LAB_001ad92c;
                if (*(int *)((this_00->m_base).buffer + uVar7 * 4) == -1) {
                  ArrayBase::push_back(&local_b0,(uint8_t *)&local_c8);
                }
              }
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < (ulong)local_80._8_8_ >> 0x20);
        }
        if ((ulong)local_b0.size == 1) {
          if ((this->m_nextColocalVertex).m_base.size <= (uint)local_cc) goto LAB_001ad92c;
          *(float *)((this_00->m_base).buffer + (ulong)(uint)local_cc * 4) = local_cc;
        }
        else {
          this->m_colocalVertexCount = this->m_colocalVertexCount + local_b0.size;
          if (1 < (int)local_b0.size) {
            uVar8 = 1;
            do {
              uVar4 = *(uint *)(local_b0.buffer + uVar8 * 4);
              uVar7 = uVar8;
              do {
                if (*(uint *)(local_b0.buffer + (uVar7 - 1 & 0xffffffff) * 4) <= uVar4)
                goto LAB_001ad860;
                *(uint *)(local_b0.buffer + uVar7 * 4) =
                     *(uint *)(local_b0.buffer + (uVar7 - 1 & 0xffffffff) * 4);
                bVar6 = 1 < (long)uVar7;
                uVar7 = uVar7 - 1;
              } while (bVar6);
              uVar7 = 0;
LAB_001ad860:
              *(uint *)(local_b0.buffer + (long)(int)uVar7 * 4) = uVar4;
              uVar8 = uVar8 + 1;
            } while (uVar8 != local_b0.size);
          }
          if (local_b0.size != 0) {
            puVar5 = (this_00->m_base).buffer;
            uVar8 = 0;
            do {
              lVar9 = uVar8 * 4;
              if ((this->m_nextColocalVertex).m_base.size <= *(uint *)(local_b0.buffer + lVar9))
              goto LAB_001ad92c;
              uVar8 = uVar8 + 1;
              uVar7 = uVar8 & 0xffffffff;
              if ((uint)uVar8 == local_b0.size) {
                uVar7 = 0;
              }
              *(undefined4 *)(puVar5 + (ulong)*(uint *)(local_b0.buffer + lVar9) * 4) =
                   *(undefined4 *)(local_b0.buffer + uVar7 * 4);
            } while ((uint)uVar8 < local_b0.size);
          }
          if ((this->m_nextColocalVertex).m_base.size <= (uint)local_cc) goto LAB_001ad92c;
          if (*(int *)((this_00->m_base).buffer + (ulong)(uint)local_cc * 4) == -1) {
            __assert_fail("m_nextColocalVertex[i] != (4294967295U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x9d8,"void xatlas::internal::Mesh::createColocals()");
          }
        }
      }
      local_cc = (float)((int)local_cc + 1);
    } while ((uint)local_cc < (uint)newCapacity);
  }
  ArrayBase::~ArrayBase(&local_80);
  ArrayBase::~ArrayBase(&local_b0);
  ArrayBase::~ArrayBase(&local_68.m_nodes.m_base);
  ArrayBase::~ArrayBase(&local_68.m_objectIds.m_base);
  ArrayBase::~ArrayBase(&local_98);
  return;
}

Assistant:

void createColocals()
	{
		const uint32_t vertexCount = m_positions.size();
		Array<AABB> aabbs(MemTag::BVH);
		aabbs.resize(vertexCount);
		for (uint32_t i = 0; i < m_positions.size(); i++)
			aabbs[i] = AABB(m_positions[i], m_epsilon);
		BVH bvh(aabbs);
		Array<uint32_t> colocals(MemTag::MeshColocals);
		Array<uint32_t> potential(MemTag::MeshColocals);
		m_colocalVertexCount = 0;
		m_nextColocalVertex.resize(vertexCount);
		for (uint32_t i = 0; i < vertexCount; i++)
			m_nextColocalVertex[i] = UINT32_MAX;
		for (uint32_t i = 0; i < vertexCount; i++) {
			if (m_nextColocalVertex[i] != UINT32_MAX)
				continue; // Already linked.
			// Find other vertices colocal to this one.
			colocals.clear();
			colocals.push_back(i); // Always add this vertex.
			bvh.query(AABB(m_positions[i], m_epsilon), potential);
			for (uint32_t j = 0; j < potential.size(); j++) {
				const uint32_t otherVertex = potential[j];
				if (otherVertex != i && equal(m_positions[i], m_positions[otherVertex], m_epsilon) && m_nextColocalVertex[otherVertex] == UINT32_MAX)
					colocals.push_back(otherVertex);
			}
			if (colocals.size() == 1) {
				// No colocals for this vertex.
				m_nextColocalVertex[i] = i;
				continue; 
			}
			m_colocalVertexCount += colocals.size();
			// Link in ascending order.
			insertionSort(colocals.data(), colocals.size());
			for (uint32_t j = 0; j < colocals.size(); j++)
				m_nextColocalVertex[colocals[j]] = colocals[(j + 1) % colocals.size()];
			XA_DEBUG_ASSERT(m_nextColocalVertex[i] != UINT32_MAX);
		}
	}